

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

int __thiscall CTxMemPool::Expire(CTxMemPool *this,seconds time)

{
  CTxMemPool *pCVar1;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar2;
  pointer poVar3;
  int iVar4;
  CTxMemPool *pCVar5;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar6;
  CTxMemPool *this_00;
  CTxMemPool *pCVar7;
  long in_FS_OFFSET;
  setEntries stage;
  setEntries toremove;
  undefined1 local_98 [16];
  _Base_ptr local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  size_t local_70;
  undefined1 local_68 [16];
  _Base_ptr local_58;
  CTxMemPool *local_50;
  CTxMemPool *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  phVar2 = (this->mapTx).
           super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
           .member;
  poVar3 = *(pointer *)
            ((long)&(phVar2->
                    super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                    ).
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                    .
                    super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    .
                    super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                    .
                    super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                    .
                    super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                    .super_type + 8);
  phVar6 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            *)&poVar3[-0xd].
               super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
               .super_type.right_;
  if (poVar3 == (pointer)0x0) {
    phVar6 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
              *)0x0;
  }
  pCVar1 = (CTxMemPool *)(local_68 + 8);
  local_68._8_4_ = _S_red;
  local_58 = (_Base_ptr)0x0;
  local_40 = 0;
  local_50 = pCVar1;
  local_48 = pCVar1;
  if (phVar6 == phVar2) {
    local_80 = (_Base_ptr)(local_98 + 8);
    local_98._8_4_ = _S_red;
    local_88 = (_Base_ptr)0x0;
    local_70 = 0;
    local_78 = local_80;
  }
  else {
    this_00 = this;
    do {
      if (time.__r <=
          *(long *)((long)&(phVar6->
                           super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                           ).
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                           .
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                           .
                           super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                           .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                           .super_pod_value_holder<CTxMemPoolEntry>.space + 0x88)) break;
      local_98._0_8_ = phVar6;
      std::
      _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
      ::
      _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>
                ((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                  *)local_68,
                 (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                  *)local_98);
      local_98._0_8_ =
           &(phVar6->
            super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
            ).
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
            .
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
            .
            super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
      ;
      this_00 = (CTxMemPool *)local_98;
      boost::multi_index::detail::
      ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
      ::increment((pointer *)local_98);
      phVar6 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                *)((long)&(((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                             *)(local_98._0_8_ + -0x178))->
                          super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                          ).
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                          .
                          super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                          .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                          super_pod_value_holder<CTxMemPoolEntry>.space + 0x50);
      if ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
           *)local_98._0_8_ ==
          (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
           *)0x0) {
        phVar6 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                  *)0x0;
      }
    } while (phVar6 != (this->mapTx).
                       super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
                       .member);
    local_80 = (_Base_ptr)(local_98 + 8);
    local_98._8_4_ = _S_red;
    local_88 = (_Base_ptr)0x0;
    local_70 = 0;
    local_78 = local_80;
    pCVar7 = local_50;
    while (pCVar7 != pCVar1) {
      CalculateDescendants
                (this_00,(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                          *)pCVar7->lastRollingFeeUpdate,(setEntries *)local_98);
      pCVar5 = (CTxMemPool *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar7);
      this_00 = pCVar7;
      pCVar7 = pCVar5;
    }
  }
  RemoveStaged(this,(setEntries *)local_98,false,EXPIRY);
  iVar4 = (int)local_70;
  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_98);
  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int CTxMemPool::Expire(std::chrono::seconds time)
{
    AssertLockHeld(cs);
    indexed_transaction_set::index<entry_time>::type::iterator it = mapTx.get<entry_time>().begin();
    setEntries toremove;
    while (it != mapTx.get<entry_time>().end() && it->GetTime() < time) {
        toremove.insert(mapTx.project<0>(it));
        it++;
    }
    setEntries stage;
    for (txiter removeit : toremove) {
        CalculateDescendants(removeit, stage);
    }
    RemoveStaged(stage, false, MemPoolRemovalReason::EXPIRY);
    return stage.size();
}